

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

UChar * u_strFindLast_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  UChar UVar1;
  UChar UVar2;
  long lVar3;
  long lVar4;
  UChar *pUVar5;
  long lVar6;
  UChar *pUVar7;
  UChar *t_1;
  UChar *pUVar8;
  UChar *pUVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (subLength < -1 || sub == (UChar *)0x0) {
    return s;
  }
  if (-2 < length && s != (UChar *)0x0) {
    if (subLength < 0) {
      subLength = -1;
      pUVar5 = sub;
      do {
        subLength = subLength + 1;
        UVar1 = *pUVar5;
        pUVar5 = pUVar5 + 1;
      } while (UVar1 != L'\0');
    }
    if (subLength == 0) {
      return s;
    }
    lVar12 = (long)subLength;
    UVar1 = sub[lVar12 + -1];
    iVar10 = subLength + -1;
    if ((iVar10 == 0) && ((UVar1 & 0xf800U) != 0xd800)) {
      if (-1 < length) {
        pUVar5 = u_memrchr_63(s,UVar1,length);
        return pUVar5;
      }
      pUVar5 = u_strrchr_63(s,UVar1);
      return pUVar5;
    }
    if (length < 0) {
      length = -1;
      pUVar5 = s;
      do {
        length = length + 1;
        UVar2 = *pUVar5;
        pUVar5 = pUVar5 + 1;
      } while (UVar2 != L'\0');
    }
    if ((subLength <= length) && (iVar10 != length)) {
      lVar6 = (long)length;
      pUVar5 = s + lVar6;
      lVar11 = lVar6 * -2;
      lVar13 = -2;
      pUVar8 = s + lVar6;
      do {
        lVar11 = lVar11 + 2;
        pUVar5 = pUVar5 + -1;
        pUVar9 = pUVar8 + -1;
        if (pUVar8[-1] == UVar1) {
          pUVar7 = pUVar9;
          lVar6 = 0;
          do {
            if (lVar12 * -2 + 2 == lVar6) {
              if (((lVar11 == lVar6) ||
                  ((*(ushort *)((long)pUVar8 + lVar6 + -2) & 0xfc00) != 0xdc00)) ||
                 ((*(ushort *)((long)pUVar8 + lVar6 + -4) & 0xfc00) != 0xd800)) {
                if ((pUVar8[-1] & 0xfc00U) != 0xd800) {
                  return pUVar7;
                }
                if (lVar13 + lVar6 == 0) {
                  return pUVar7;
                }
                if ((*pUVar8 & 0xfc00U) != 0xdc00) {
                  return (UChar *)((long)pUVar5 + lVar6);
                }
              }
              break;
            }
            pUVar7 = pUVar7 + -1;
            lVar4 = lVar6 + -4;
            lVar3 = lVar6 + lVar12 * 2 + -4;
            lVar6 = lVar6 + -2;
          } while (*(short *)((long)pUVar8 + lVar4) == *(short *)((long)sub + lVar3));
        }
        lVar13 = lVar13 + -2;
        pUVar8 = pUVar9;
        if (s + iVar10 == pUVar9) {
          return (UChar *)0x0;
        }
      } while( true );
    }
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindLast(const UChar *s, int32_t length,
              const UChar *sub, int32_t subLength) {
    const UChar *start, *limit, *p, *q, *subLimit;
    UChar c, cs;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    /*
     * This implementation is more lazy than the one for u_strFindFirst():
     * There is no special search code for NUL-terminated strings.
     * It does not seem to be worth it for searching substrings to
     * search forward and find all matches like in u_strrchr() and similar.
     * Therefore, we simply get both string lengths and search backward.
     *
     * markus 2002oct23
     */

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[subLength-1] to search for it fast */
    subLimit=sub+subLength;
    cs=*(--subLimit);
    --subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strrchr(s, cs) : u_memrchr(s, cs, length);
    }

    if(length<0) {
        length=u_strlen(s);
    }

    /* subLength was decremented above */
    if(length<=subLength) {
        return NULL; /* s is shorter than sub */
    }

    start=s;
    limit=s+length;

    /* the substring must start no later than s+subLength */
    s+=subLength;

    while(s!=limit) {
        c=*(--limit);
        if(c==cs) {
            /* found last substring UChar, compare rest */
            p=limit;
            q=subLimit;
            for(;;) {
                if(q==sub) {
                    if(isMatchAtCPBoundary(start, p, limit+1, start+length)) {
                        return (UChar *)p; /* well-formed match */
                    } else {
                        break; /* no match because surrogate pair is split */
                    }
                }
                if(*(--p)!=*(--q)) {
                    break; /* no match */
                }
            }
        }
    }

    /* not found */
    return NULL;
}